

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall deqp::egl::GLES2ThreadTest::EGLThread::deinit(EGLThread *this)

{
  GLES2Context *pGVar1;
  EGLContext pvVar2;
  
  pGVar1 = (this->runtimeContext).m_ptr;
  if (pGVar1 != (GLES2Context *)0x0) {
    if (pGVar1->context == (EGLContext)0x0) {
      pvVar2 = (EGLContext)0x0;
    }
    else {
      (*this->egl->_vptr_Library[0x27])(this->egl,pGVar1->display,0,0,0);
      pGVar1 = (this->runtimeContext).m_ptr;
      pvVar2 = pGVar1->context;
    }
    (*this->egl->_vptr_Library[0x13])(this->egl,pGVar1->display,pvVar2);
    pGVar1 = (this->runtimeContext).m_ptr;
    pGVar1->context = (EGLContext)0x0;
    (*this->egl->_vptr_Library[0x16])(this->egl,pGVar1->display,this->eglSurface);
    this->eglSurface = (EGLSurface)0x0;
  }
  (*this->egl->_vptr_Library[0x2d])();
  return;
}

Assistant:

void EGLThread::deinit (void)
{
	if (runtimeContext)
	{
		if (runtimeContext->context != EGL_NO_CONTEXT)
			egl.makeCurrent(runtimeContext->display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);

		egl.destroyContext(runtimeContext->display, runtimeContext->context);
		runtimeContext->context = EGL_NO_CONTEXT;

		egl.destroySurface(runtimeContext->display, eglSurface);
		eglSurface	= EGL_NO_SURFACE;
	}

	egl.releaseThread();
}